

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiodevice.cpp
# Opt level: O1

ssize_t __thiscall QIODevice::write(QIODevice *this,int __fd,void *__buf,size_t __n)

{
  AccessMode AVar1;
  QIODevicePrivate *pQVar2;
  QRingBuffer *this_00;
  int iVar3;
  int extraout_var;
  void *pvVar4;
  undefined4 in_register_00000034;
  void *__ptr;
  undefined1 auVar5 [16];
  
  pvVar4 = (void *)0xffffffffffffffff;
  if ((-1 < (long)__buf) &&
     (pQVar2 = (this->d_ptr)._M_t.
               super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>._M_t.
               super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>.
               super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl,
     ((Int)(pQVar2->openMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
           super_QFlagsStorage<QIODeviceBase::OpenModeFlag> & 2) != 0)) {
    if (pQVar2->accessMode == Unset) {
      iVar3 = (*pQVar2->q_ptr->_vptr_QIODevice[2])();
      pQVar2->accessMode = RandomAccess - (char)iVar3;
    }
    AVar1 = pQVar2->accessMode;
    if (((AVar1 != Sequential) && (pQVar2->pos != pQVar2->devicePos)) &&
       (iVar3 = (*this->_vptr_QIODevice[7])(this), (char)iVar3 == '\0')) {
      return -1;
    }
    iVar3 = (*this->_vptr_QIODevice[0x12])(this,CONCAT44(in_register_00000034,__fd),__buf);
    pvVar4 = (void *)CONCAT44(extraout_var,iVar3);
    if ((pvVar4 != (void *)0x0 && -1 < extraout_var) && AVar1 != Sequential) {
      auVar5._0_8_ = CONCAT44(extraout_var,iVar3);
      auVar5._8_4_ = iVar3;
      auVar5._12_4_ = extraout_var;
      pQVar2->pos = auVar5._0_8_ + pQVar2->pos;
      pQVar2->devicePos = auVar5._8_8_ + pQVar2->devicePos;
      this_00 = (pQVar2->buffer).m_buf;
      if (this_00 != (QRingBuffer *)0x0) {
        __ptr = pvVar4;
        if ((long)this_00->bufferSize < (long)pvVar4) {
          __ptr = (void *)this_00->bufferSize;
        }
        QRingBuffer::free(this_00,__ptr);
      }
    }
  }
  return (ssize_t)pvVar4;
}

Assistant:

qint64 QIODevice::write(const char *data, qint64 maxSize)
{
    Q_D(QIODevice);
    CHECK_WRITABLE(write, qint64(-1));
    CHECK_MAXLEN(write, qint64(-1));

    const bool sequential = d->isSequential();
    // Make sure the device is positioned correctly.
    if (d->pos != d->devicePos && !sequential && !seek(d->pos))
        return qint64(-1);

#ifdef Q_OS_WIN
    if (d->openMode & Text) {
        const char *endOfData = data + maxSize;
        const char *startOfBlock = data;

        qint64 writtenSoFar = 0;
        const qint64 savedPos = d->pos;

        forever {
            const char *endOfBlock = startOfBlock;
            while (endOfBlock < endOfData && *endOfBlock != '\n')
                ++endOfBlock;

            qint64 blockSize = endOfBlock - startOfBlock;
            if (blockSize > 0) {
                qint64 ret = writeData(startOfBlock, blockSize);
                if (ret <= 0) {
                    if (writtenSoFar && !sequential)
                        d->buffer.skip(d->pos - savedPos);
                    return writtenSoFar ? writtenSoFar : ret;
                }
                if (!sequential) {
                    d->pos += ret;
                    d->devicePos += ret;
                }
                writtenSoFar += ret;
            }

            if (endOfBlock == endOfData)
                break;

            qint64 ret = writeData("\r\n", 2);
            if (ret <= 0) {
                if (writtenSoFar && !sequential)
                    d->buffer.skip(d->pos - savedPos);
                return writtenSoFar ? writtenSoFar : ret;
            }
            if (!sequential) {
                d->pos += ret;
                d->devicePos += ret;
            }
            ++writtenSoFar;

            startOfBlock = endOfBlock + 1;
        }

        if (writtenSoFar && !sequential)
            d->buffer.skip(d->pos - savedPos);
        return writtenSoFar;
    }
#endif

    qint64 written = writeData(data, maxSize);
    if (!sequential && written > 0) {
        d->pos += written;
        d->devicePos += written;
        d->buffer.skip(written);
    }
    return written;
}